

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_table_info.cpp
# Opt level: O2

void __thiscall
duckdb::AlterViewInfo::AlterViewInfo(AlterViewInfo *this,AlterViewType type,AlterEntryData *data)

{
  string local_90;
  string local_70;
  string local_50;
  
  ::std::__cxx11::string::string((string *)&local_50,(string *)data);
  ::std::__cxx11::string::string((string *)&local_70,(string *)&data->schema);
  ::std::__cxx11::string::string((string *)&local_90,(string *)&data->name);
  AlterInfo::AlterInfo
            (&this->super_AlterInfo,ALTER_VIEW,&local_50,&local_70,&local_90,data->if_not_found);
  ::std::__cxx11::string::~string((string *)&local_90);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_50);
  (this->super_AlterInfo).super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__AlterTableInfo_027a7e70;
  (this->super_AlterInfo).field_0x71 = type;
  return;
}

Assistant:

AlterViewInfo::AlterViewInfo(AlterViewType type, AlterEntryData data)
    : AlterInfo(AlterType::ALTER_VIEW, std::move(data.catalog), std::move(data.schema), std::move(data.name),
                data.if_not_found),
      alter_view_type(type) {
}